

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O1

void do_buy(CHAR_DATA *ch,char *argument)

{
  byte *pbVar1;
  short sVar2;
  ROOM_INDEX_DATA *pRVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  CHAR_DATA *pCVar9;
  ROOM_INDEX_DATA *pRVar10;
  OBJ_DATA *pOVar11;
  OBJ_DATA *obj_to;
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *obj;
  long lVar12;
  char *pcVar13;
  CProficiencies *pCVar14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  uint uVar15;
  ulong uVar16;
  long cost;
  OBJ_DATA *pOVar17;
  float fVar18;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  string buffer;
  char buf [4608];
  char arg [4608];
  string local_2478;
  char *local_2458 [2];
  char *local_2448;
  char local_2438 [4608];
  char local_1238 [4616];
  
  bVar4 = check_horde(ch);
  if (bVar4) {
    pcVar13 = "You would never buy what can be be taken!\n\r";
LAB_00265cb3:
    send_to_char(pcVar13,ch);
    return;
  }
  if (*argument == '\0') {
    pcVar13 = "Buy what?\n\r";
    goto LAB_00265cb3;
  }
  if ((ch->in_room->room_flags[0] & 0x1000) != 0) {
    bVar4 = is_npc(ch);
    if (bVar4) {
      return;
    }
    pcVar13 = one_argument(argument,local_1238);
    pRVar10 = get_room_index(0);
    pRVar3 = ch->in_room;
    if (pRVar10 == (ROOM_INDEX_DATA *)0x0) {
      fmt._M_str = "Do_buy: bad pet shop at vnum {}.";
      fmt._M_len = 0x20;
      CLogger::Debug<short&>((CLogger *)&RS.field_0x140,fmt,&pRVar3->vnum);
    }
    else {
      ch->in_room = pRVar10;
      pCVar9 = get_char_room(ch,local_1238);
      ch->in_room = pRVar3;
      if ((pCVar9 != (CHAR_DATA *)0x0) && ((pCVar9->act[0] & 0x100) != 0)) {
        if (ch->pet == (CHAR_DATA *)0x0) {
          sVar2 = pCVar9->level;
          cost = (long)sVar2 * (long)sVar2 * 10;
          if (ch->gold < cost) {
            pcVar13 = "You can\'t afford it.\n\r";
            goto LAB_00265e01;
          }
          if (ch->level < sVar2) {
            pcVar13 = "You\'re not powerful enough to master this pet.\n\r";
            goto LAB_00265e01;
          }
          iVar7 = number_percent();
          iVar8 = get_skill(ch,(int)gsn_haggle);
          if (iVar7 < iVar8) {
            bVar4 = false;
          }
          else {
            if (ch->pcdata == (PC_DATA *)0x0) {
              pCVar14 = &prof_none;
            }
            else {
              pCVar14 = &ch->pcdata->profs;
            }
            bVar4 = CProficiencies::HasProf(pCVar14,"appraising");
            if (!bVar4) goto LAB_002661f4;
          }
          iVar8 = get_skill(ch,(int)gsn_haggle);
          if (0x3c < iVar8) {
            lVar12 = (long)iVar7 * (cost / 3);
            lVar12 = SUB168(SEXT816(lVar12) * SEXT816(0x5c28f5c28f5c28f5),8) - lVar12;
            cost = cost + ((lVar12 >> 6) - (lVar12 >> 0x3f));
          }
          sprintf(local_2438,"You haggle the price down to %ld coins.\n\r",cost);
          if (bVar4 == true && cost != 0) {
            if (ch->pcdata == (PC_DATA *)0x0) {
              pCVar14 = &prof_none;
            }
            else {
              pCVar14 = &ch->pcdata->profs;
            }
            fVar18 = CProficiencies::ProfEffect(pCVar14,"appraising",0.0);
            cost = (long)(int)((fVar18 * (float)cost) / 100.0);
            sprintf(local_2438,"Knowing it is inflated, you argue the price down to %ld coins.\n\r",
                    cost);
          }
          send_to_char(local_2438,ch);
          check_improve(ch,(int)gsn_haggle,true,4);
LAB_002661f4:
          deduct_cost(ch,cost);
          pCVar9 = create_mobile(pCVar9->pIndexData);
          pbVar1 = (byte *)((long)pCVar9->act + 1);
          *pbVar1 = *pbVar1 | 1;
          pbVar1 = (byte *)((long)pCVar9->affected_by + 2);
          *pbVar1 = *pbVar1 | 4;
          pbVar1 = (byte *)((long)pCVar9->comm + 2);
          *pbVar1 = *pbVar1 | 0x70;
          one_argument(pcVar13,local_1238);
          if (local_1238[0] != '\0') {
            local_2458[0] = pCVar9->name;
            fmt_00.size_ = 0xcc;
            fmt_00.data_ = (char *)0x5;
            args.field_1.args_ = in_R9.args_;
            args.desc_ = (unsigned_long_long)local_2458;
            local_2448 = local_1238;
            ::fmt::v9::vformat_abi_cxx11_(&local_2478,(v9 *)0x3b0333,fmt_00,args);
            free_pstring(pCVar9->name);
            pcVar13 = palloc_string(local_2478._M_dataplus._M_p);
            pCVar9->name = pcVar13;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2478._M_dataplus._M_p != &local_2478.field_2) {
              operator_delete(local_2478._M_dataplus._M_p,
                              local_2478.field_2._M_allocated_capacity + 1);
            }
          }
          sprintf(local_2438,"%sA neck tag says \'I belong to %s\'.\n\r",pCVar9->description,
                  ch->name);
          free_pstring(pCVar9->description);
          pcVar13 = palloc_string(local_2438);
          pCVar9->description = pcVar13;
          char_to_room(pCVar9,ch->in_room);
          add_follower(pCVar9,ch);
          pCVar9->leader = ch;
          ch->pet = pCVar9;
          send_to_char("Enjoy your pet.\n\r",ch);
          act("$n bought $N as a pet.",ch,(void *)0x0,pCVar9,0);
          return;
        }
        pcVar13 = "You already own a pet.\n\r";
        goto LAB_00265e01;
      }
    }
    pcVar13 = "Sorry, you can\'t buy that here.\n\r";
    goto LAB_00265e01;
  }
  pCVar9 = find_keeper(ch);
  if (pCVar9 == ch || pCVar9 == (CHAR_DATA *)0x0) {
    return;
  }
  pcVar13 = one_argument(argument,local_1238);
  if (*pcVar13 == '\0') {
    uVar6 = 1;
  }
  else {
    uVar6 = atoi(pcVar13);
  }
  pOVar11 = get_obj_keeper(ch,pCVar9,local_1238);
  if ((pOVar11 == (OBJ_DATA *)0x0) || (pCVar9->pIndexData->pShop == (SHOP_DATA *)0x0)) {
    uVar16 = 0;
  }
  else {
    iVar7 = pOVar11->cost;
    fVar18 = calculate_inflation();
    fVar18 = floorf(fVar18 * (float)iVar7);
    uVar16 = (ulong)fVar18;
  }
  if ((int)uVar6 < 1) {
    interpret(pCVar9,"snort");
    return;
  }
  if (9 < (int)uVar6) {
    do_say(pCVar9,"I\'m not selling you that many at once.");
    return;
  }
  if (((long)uVar16 < 1) || (bVar4 = can_see_obj(ch,pOVar11), !bVar4)) {
    sprintf(local_2438,"%s I don\'t sell that, try \'list\'ing to see what I do sell.",ch->name);
    do_tell(pCVar9,local_2438);
    return;
  }
  bVar4 = is_obj_stat(pOVar11,0xd);
  if (!bVar4) {
    pOVar17 = pOVar11->next_content;
    bVar4 = uVar6 != 1;
    if ((pOVar17 != (OBJ_DATA *)0x0 && bVar4) && (pOVar17->pIndexData == pOVar11->pIndexData)) {
      iVar7 = 2;
      do {
        bVar5 = str_cmp(pOVar17->short_descr,pOVar11->short_descr);
        if (((bVar5) || (bVar4 = iVar7 < (int)uVar6, (int)uVar6 <= iVar7)) ||
           (pOVar17 = pOVar17->next_content, pOVar17 == (OBJ_DATA *)0x0)) break;
        iVar7 = iVar7 + 1;
      } while (pOVar17->pIndexData == pOVar11->pIndexData);
    }
    if (bVar4) {
      pcVar13 = "$n tells you \'I don\'t have that many in stock.";
      pOVar11 = (OBJ_DATA *)0x0;
      goto LAB_00265f4a;
    }
  }
  if (ch->gold < (long)(uVar16 * uVar6)) {
    pcVar13 = "$n tells you \'You can\'t afford to buy that many.";
    if (uVar6 == 1) {
      pcVar13 = "$n tells you \'You can\'t afford to buy $p\'.";
    }
LAB_00265f4a:
    act(pcVar13,pCVar9,pOVar11,ch,2);
    ch->reply = pCVar9;
    return;
  }
  if (ch->level < pOVar11->level) {
    pcVar13 = "$n tells you \'You can\'t use $p yet\'.";
    goto LAB_00265f4a;
  }
  sVar2 = ch->carry_number;
  iVar7 = get_obj_number(pOVar11);
  iVar8 = can_carry_n(ch);
  if (iVar8 < (int)(iVar7 * uVar6 + (int)sVar2)) {
    pcVar13 = "You can\'t carry that many items.\n\r";
LAB_00265e01:
    send_to_char(pcVar13,ch);
    return;
  }
  sVar2 = ch->carry_weight;
  iVar7 = get_obj_weight(pOVar11);
  iVar8 = can_carry_w(ch);
  if (iVar8 < (int)(iVar7 * uVar6 + (int)sVar2)) {
    pcVar13 = "You can\'t carry that much weight.\n\r";
    goto LAB_00265e01;
  }
  bVar4 = check_benevolence(ch,pCVar9);
  uVar16 = uVar16 >> bVar4;
  iVar7 = number_percent();
  bVar4 = is_obj_stat(pOVar11,0x16);
  if ((bVar4) || (iVar8 = get_skill(ch,(int)gsn_haggle), iVar8 <= iVar7)) {
    if (ch->pcdata == (PC_DATA *)0x0) {
      pCVar14 = &prof_none;
    }
    else {
      pCVar14 = &ch->pcdata->profs;
    }
    bVar4 = CProficiencies::HasProf(pCVar14,"appraising");
    if (!bVar4) goto LAB_0026646c;
  }
  else {
    bVar4 = false;
  }
  iVar8 = get_skill(ch,(int)gsn_haggle);
  if (0x3c < iVar8) {
    uVar16 = uVar16 - (long)(((pOVar11->cost / 2) * iVar7) / 100);
  }
  if ((bVar4 & uVar16 != 0) == 1) {
    if (ch->pcdata == (PC_DATA *)0x0) {
      pCVar14 = &prof_none;
    }
    else {
      pCVar14 = &ch->pcdata->profs;
    }
    fVar18 = CProficiencies::ProfEffect(pCVar14,"appraising",0.0);
    fVar18 = floorf((fVar18 * (float)(long)uVar16) / 100.0);
    uVar16 = (ulong)fVar18;
    sprintf(local_2438,"Knowing it is inflated, you argue the price down to %ld coins.\n\r",uVar16);
    send_to_char(local_2438,ch);
  }
  else {
    act("You haggle with $N.",ch,(void *)0x0,pCVar9,3);
  }
  check_improve(ch,(int)gsn_haggle,true,4);
LAB_0026646c:
  act("$n hands some gold to $N.",ch,(void *)0x0,pCVar9,0);
  sprintf(local_2438,"You hand $N %ld gold.");
  act(local_2438,ch,(void *)0x0,pCVar9,3);
  uVar15 = 1;
  if (1 < (int)uVar6) {
    uVar15 = uVar6;
  }
  do {
    act("$N hands you $p.",ch,pOVar11,pCVar9,3);
    act("$N hands $n $p.",ch,pOVar11,pCVar9,0);
    uVar15 = uVar15 - 1;
  } while (uVar15 != 0);
  deduct_cost(ch,uVar6 * uVar16);
  uVar15 = 1;
  if (1 < (int)uVar6) {
    uVar15 = uVar6;
  }
  uVar6 = 0;
  do {
    if ((pOVar11->extra_flags[0] & 0x2000) == 0) {
      pOVar17 = pOVar11->next_content;
      obj_from_char(pOVar11);
      obj_to = pOVar11;
    }
    else {
      obj_to = create_object(pOVar11->pIndexData,(int)pOVar11->level);
      pOVar17 = pOVar11;
      if (pOVar11->item_type == 0xf) {
        for (pOVar11 = pOVar11->contains; pOVar11 != (OBJ_DATA *)0x0;
            pOVar11 = pOVar11->next_content) {
          pObjIndex = get_obj_index(0);
          obj = create_object(pObjIndex,(int)pOVar11->level);
          obj_to_obj(obj,obj_to);
        }
      }
    }
    if (0 < obj_to->timer) {
      obj_to->timer = 0;
    }
    obj_to_char(obj_to,ch);
    if ((long)uVar16 < (long)obj_to->cost) {
      obj_to->cost = (int)uVar16;
    }
    uVar6 = uVar6 + 1;
    pOVar11 = pOVar17;
  } while (uVar6 != uVar15);
  return;
}

Assistant:

void do_buy(CHAR_DATA *ch, char *argument)
{
	int roll;
	long cost;
	int i;

	if (check_horde(ch))
	{
		send_to_char("You would never buy what can be be taken!\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		send_to_char("Buy what?\n\r", ch);
		return;
	}

	if (IS_SET(ch->in_room->room_flags, ROOM_PET_SHOP))
	{
		char arg[MAX_INPUT_LENGTH];
		char buf[MAX_STRING_LENGTH];
		CHAR_DATA *pet;
		ROOM_INDEX_DATA *pRoomIndexNext;
		ROOM_INDEX_DATA *in_room;

		if (is_npc(ch))
			return;

		argument = one_argument(argument, arg);

		/* hack to make new thalos pets work */
		pRoomIndexNext = get_room_index(ch->in_room->vnum + 1);
		if (pRoomIndexNext == nullptr)
		{
			RS.Logger.Debug("Do_buy: bad pet shop at vnum {}.", ch->in_room->vnum);
			send_to_char("Sorry, you can't buy that here.\n\r", ch);
			return;
		}

		in_room = ch->in_room;
		ch->in_room = pRoomIndexNext;
		pet = get_char_room(ch, arg);
		ch->in_room = in_room;

		if (pet == nullptr || !IS_SET(pet->act, ACT_PET))
		{
			send_to_char("Sorry, you can't buy that here.\n\r", ch);
			return;
		}

		if (ch->pet != nullptr)
		{
			send_to_char("You already own a pet.\n\r", ch);
			return;
		}

		cost = 10L * pet->level * pet->level;

		if (ch->gold < cost)
		{
			send_to_char("You can't afford it.\n\r", ch);
			return;
		}

		if (ch->level < pet->level)
		{
			send_to_char("You're not powerful enough to master this pet.\n\r", ch);
			return;
		}

		/* haggle */
		roll = number_percent();

		bool appraised= false;

		if (roll < get_skill(ch, gsn_haggle) || (appraised = ch->Profs()->HasProf("appraising")))
		{
			if (get_skill(ch, gsn_haggle) > 60)
				cost -= cost / 3 * roll / 100;

			sprintf(buf, "You haggle the price down to %ld coins.\n\r", cost);

			if (appraised && cost)
			{
				float mcost = cost * ch->Profs()->ProfEffect("appraising") / 100;
				cost = (int)mcost;

				sprintf(buf, "Knowing it is inflated, you argue the price down to %ld coins.\n\r", cost);
			}

			send_to_char(buf, ch);
			check_improve(ch, gsn_haggle, true, 4);
		}

		deduct_cost(ch, cost);

		pet = create_mobile(pet->pIndexData);

		SET_BIT(pet->act, ACT_PET);
		SET_BIT(pet->affected_by, AFF_CHARM);
		SET_BIT(pet->comm, COMM_NOTELL);
		SET_BIT(pet->comm, COMM_NOSHOUT);
		SET_BIT(pet->comm, COMM_NOCHANNELS);

		argument = one_argument(argument, arg);

		if (arg[0] != '\0')
		{
			auto buffer = fmt::format("{} {}", pet->name, arg);
			free_pstring(pet->name);
			pet->name = palloc_string(buffer.c_str()); // TODO: not sure what palloc_string does
		}

		sprintf(buf, "%sA neck tag says 'I belong to %s'.\n\r", pet->description, ch->name);

		free_pstring(pet->description);
		pet->description = palloc_string(buf);

		char_to_room(pet, ch->in_room);
		add_follower(pet, ch);

		pet->leader = ch;
		ch->pet = pet;

		send_to_char("Enjoy your pet.\n\r", ch);
		act("$n bought $N as a pet.", ch, nullptr, pet, TO_ROOM);
		return;
	}
	else
	{
		CHAR_DATA *keeper;
		OBJ_DATA *obj = nullptr, *t_obj = nullptr, *d_obj = nullptr, *c_obj = nullptr;
		char arg[MAX_INPUT_LENGTH], buf[MSL];
		int number = 1, count = 1;

		keeper = find_keeper(ch);

		if (keeper == nullptr)
			return;

		if (keeper == ch)
			return;

		argument = one_argument(argument, arg);

		if (argument[0] != '\0')
			number = atoi(argument);

		obj = get_obj_keeper(ch, keeper, arg);
		cost = get_cost(keeper, obj, true);

		if (number < 1)
		{
			interpret(keeper, "snort");
			return;
		}

		if (number > 9)
		{
			do_say(keeper, "I'm not selling you that many at once.");
			return;
		}

		if (cost <= 0 || !can_see_obj(ch, obj))
		{
			sprintf(buf, "%s I don't sell that, try 'list'ing to see what I do sell.", ch->name);
			do_tell(keeper, buf);
			return;
		}

		if (!is_obj_stat(obj, ITEM_INVENTORY))
		{
			for (t_obj = obj->next_content; count < number && t_obj != nullptr; t_obj = t_obj->next_content)
			{
				if (t_obj->pIndexData == obj->pIndexData && !str_cmp(t_obj->short_descr, obj->short_descr))
					count++;
				else
					break;
			}

			if (count < number)
			{
				act("$n tells you 'I don't have that many in stock.", keeper, nullptr, ch, TO_VICT);
				ch->reply = keeper;
				return;
			}
		}

		if (ch->gold < cost * number)
		{
			if (number > 1)
				act("$n tells you 'You can't afford to buy that many.", keeper, obj, ch, TO_VICT);
			else
				act("$n tells you 'You can't afford to buy $p'.", keeper, obj, ch, TO_VICT);

			ch->reply = keeper;
			return;
		}

		if (obj->level > ch->level)
		{
			act("$n tells you 'You can't use $p yet'.", keeper, obj, ch, TO_VICT);
			ch->reply = keeper;
			return;
		}

		if (ch->carry_number + number * get_obj_number(obj) > can_carry_n(ch))
		{
			send_to_char("You can't carry that many items.\n\r", ch);
			return;
		}

		if (ch->carry_weight + number * get_obj_weight(obj) > can_carry_w(ch))
		{
			send_to_char("You can't carry that much weight.\n\r", ch);
			return;
		}

		if (check_benevolence(ch, keeper))
			cost /= 2;

		/* haggle */

		roll = number_percent();
		bool appraised= false;

		if ((!is_obj_stat(obj, ITEM_SELL_EXTRACT) && roll < get_skill(ch, gsn_haggle))
			|| (appraised = ch->Profs()->HasProf("appraising")))
		{
			if (get_skill(ch, gsn_haggle) > 60)
				cost -= obj->cost / 2 * roll / 100;

			if (appraised && cost)
			{
				float mcost = floor(cost * ch->Profs()->ProfEffect("appraising") / 100);
				cost = static_cast<long>(mcost);
				sprintf(buf, "Knowing it is inflated, you argue the price down to %ld coins.\n\r", cost);
				send_to_char(buf, ch);
			}
			else
			{
				act("You haggle with $N.", ch, nullptr, keeper, TO_CHAR);
			}

			check_improve(ch, gsn_haggle, true, 4);
		}

		act("$n hands some gold to $N.", ch, 0, keeper, TO_ROOM);
		sprintf(buf, "You hand $N %ld gold.", cost * number);
		act(buf, ch, 0, keeper, TO_CHAR);

		for (i = 0; i < number; i++)
		{
			act("$N hands you $p.", ch, obj, keeper, TO_CHAR);
			act("$N hands $n $p.", ch, obj, keeper, TO_ROOM);
		}

		deduct_cost(ch, cost * number);

		for (count = 0; count < number; count++)
		{
			if (IS_SET(obj->extra_flags, ITEM_INVENTORY))
			{
				t_obj = create_object(obj->pIndexData, obj->level);

				if (obj->item_type == ITEM_CONTAINER && obj->contains)
				{
					for (c_obj = obj->contains; c_obj != nullptr; c_obj = c_obj->next_content)
					{
						d_obj = create_object(get_obj_index(c_obj->pIndexData->vnum), c_obj->level);
						obj_to_obj(d_obj, t_obj);
					}
				}
			}
			else
			{
				t_obj = obj;
				obj = obj->next_content;
				obj_from_char(t_obj);
			}

			if (t_obj->timer > 0)
				t_obj->timer = 0;

			obj_to_char(t_obj, ch);

			if (cost < t_obj->cost)
				t_obj->cost = cost;
		}
	}
}